

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

int uv_fs_event_stop(uv_fs_event_t *handle)

{
  uint *puVar1;
  uint uVar2;
  uv_loop_t *loop;
  uv__queue *puVar3;
  watcher_list *w;
  
  uVar2 = handle->flags;
  if ((uVar2 & 4) != 0) {
    loop = handle->loop;
    w = find_watcher(loop,handle->wd);
    if (w == (watcher_list *)0x0) {
      __assert_fail("w != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                    ,0xa21,"int uv_fs_event_stop(uv_fs_event_t *)");
    }
    handle->wd = -1;
    handle->path = (char *)0x0;
    handle->flags = uVar2 & 0xfffffffb;
    if ((uVar2 & 8) != 0) {
      puVar1 = &loop->active_handles;
      *puVar1 = *puVar1 - 1;
    }
    puVar3 = (handle->watchers).next;
    ((handle->watchers).prev)->next = puVar3;
    puVar3->prev = (handle->watchers).prev;
    maybe_free_watcher_list(w,handle->loop);
  }
  return 0;
}

Assistant:

int uv_fs_event_stop(uv_fs_event_t* handle) {
  struct watcher_list* w;

  if (!uv__is_active(handle))
    return 0;

  w = find_watcher(handle->loop, handle->wd);
  assert(w != NULL);

  handle->wd = -1;
  handle->path = NULL;
  uv__handle_stop(handle);
  uv__queue_remove(&handle->watchers);

  maybe_free_watcher_list(w, handle->loop);

  return 0;
}